

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaveLoadTests.cpp
# Opt level: O0

int testBasicSaveLoad(void)

{
  bool bVar1;
  int iVar2;
  Model *this;
  OneHotEncoder *this_00;
  StringVector *this_01;
  string *psVar3;
  ostream *poVar4;
  char *__filename;
  Result local_200;
  undefined1 local_1d8 [8];
  Model a2;
  vector<long,_std::allocator<long>_> local_198;
  FeatureType local_178;
  allocator<char> local_161;
  string local_160;
  Result local_140;
  undefined4 local_114;
  FeatureType local_110;
  allocator<char> local_f9;
  string local_f8;
  Result local_d8;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  OneHotEncoder ohe;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string path;
  Result r;
  
  CoreML::Result::Result((Result *)((long)&path.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"/tmp/a.modelasset",&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  CoreML::OneHotEncoder::OneHotEncoder((OneHotEncoder *)local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"foo",&local_f9);
  CoreML::FeatureType::String();
  CoreML::OneHotEncoder::addInput(&local_d8,(OneHotEncoder *)local_88,&local_f8,&local_110);
  bVar1 = CoreML::Result::good(&local_d8);
  CoreML::Result::~Result(&local_d8);
  CoreML::FeatureType::~FeatureType(&local_110);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this = CoreML::Model::getProto((Model *)local_88);
    this_00 = CoreML::Specification::Model::mutable_onehotencoder(this);
    this_01 = CoreML::Specification::OneHotEncoder::mutable_stringcategories(this_00);
    psVar3 = CoreML::Specification::StringVector::add_vector_abi_cxx11_(this_01);
    std::__cxx11::string::assign((char *)psVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"bar",&local_161);
    local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::vector(&local_198);
    CoreML::FeatureType::Array(&local_178,&local_198);
    CoreML::Model::addOutput(&local_140,(Model *)local_88,&local_160,&local_178);
    bVar1 = CoreML::Result::good(&local_140);
    CoreML::Result::~Result(&local_140);
    CoreML::FeatureType::~FeatureType(&local_178);
    std::vector<long,_std::allocator<long>_>::~vector(&local_198);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      CoreML::Model::save((Result *)
                          &a2.m_spec.
                           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,(Model *)local_88,(string *)local_58);
      bVar1 = CoreML::Result::good
                        ((Result *)
                         &a2.m_spec.
                          super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      CoreML::Result::~Result
                ((Result *)
                 &a2.m_spec.
                  super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        CoreML::Model::Model((Model *)local_1d8);
        CoreML::Model::load(&local_200,(string *)local_58,(Model *)local_1d8);
        bVar1 = CoreML::Result::good(&local_200);
        CoreML::Result::~Result(&local_200);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          bVar1 = CoreML::Model::operator==((Model *)local_88,(Model *)local_1d8);
          if (bVar1) {
            __filename = (char *)std::__cxx11::string::c_str();
            iVar2 = remove(__filename);
            if (iVar2 == 0) {
              r.m_message.field_2._12_4_ = 0;
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,":");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1b);
              poVar4 = std::operator<<(poVar4,": error: ");
              poVar4 = std::operator<<(poVar4,"(std::remove(path.c_str())) == (0)");
              poVar4 = std::operator<<(poVar4," was false, expected true.");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              r.m_message.field_2._12_4_ = 1;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1a);
            poVar4 = std::operator<<(poVar4,": error: ");
            poVar4 = std::operator<<(poVar4,"(ohe) == (a2)");
            poVar4 = std::operator<<(poVar4," was false, expected true.");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            r.m_message.field_2._12_4_ = 1;
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x19);
          poVar4 = std::operator<<(poVar4,": error: ");
          poVar4 = std::operator<<(poVar4,"(Model::load(path, a2)).good()");
          poVar4 = std::operator<<(poVar4," was false, expected true.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          r.m_message.field_2._12_4_ = 1;
        }
        local_114 = 1;
        CoreML::Model::~Model((Model *)local_1d8);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x17);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"(ohe.save(path)).good()");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        r.m_message.field_2._12_4_ = 1;
        local_114 = 1;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x16);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(ohe.addOutput(\"bar\", FeatureType::Array({}))).good()");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      r.m_message.field_2._12_4_ = 1;
      local_114 = 1;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x14);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"(ohe.addInput(\"foo\", FeatureType::String())).good()");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    r.m_message.field_2._12_4_ = 1;
    local_114 = 1;
  }
  CoreML::OneHotEncoder::~OneHotEncoder((OneHotEncoder *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  CoreML::Result::~Result((Result *)((long)&path.field_2 + 8));
  return r.m_message.field_2._12_4_;
}

Assistant:

int testBasicSaveLoad () {
    Result r;
    
    const std::string path("/tmp/a.modelasset");
    OneHotEncoder ohe;
    ML_ASSERT_GOOD(ohe.addInput("foo", FeatureType::String()));
    ohe.getProto().mutable_onehotencoder()->mutable_stringcategories()->add_vector()->assign("foo");
    ML_ASSERT_GOOD(ohe.addOutput("bar", FeatureType::Array({})));
    ML_ASSERT_GOOD(ohe.save(path));
    Model a2;
    ML_ASSERT_GOOD(Model::load(path, a2));
    ML_ASSERT_EQ(ohe, a2);
    ML_ASSERT_EQ(std::remove(path.c_str()), 0);
    
    return 0;
}